

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O2

int uv__loop_configure(uv_loop_t *loop,uv_loop_option option,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  
  if (option == UV_LOOP_BLOCK_SIGNAL) {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar3 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      piVar3 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar3 + 2;
    }
    if (*piVar3 == 0x1b) {
      *(byte *)&loop->flags = (byte)loop->flags | 1;
      return 0;
    }
    iVar2 = -0x16;
  }
  else {
    iVar2 = -0x26;
  }
  return iVar2;
}

Assistant:

int uv__loop_configure(uv_loop_t* loop, uv_loop_option option, va_list ap) {
  if (option != UV_LOOP_BLOCK_SIGNAL)
    return UV_ENOSYS;

  if (va_arg(ap, int) != SIGPROF)
    return UV_EINVAL;

  loop->flags |= UV_LOOP_BLOCK_SIGPROF;
  return 0;
}